

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void calculate_group_size
               (Am_Value_List *list,int *min_left,int *min_top,int *max_right,int *max_bottom,
               Am_Object *owner)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  int y2;
  int y1;
  int x2;
  int x1;
  Am_Object local_68 [3];
  Am_Object local_50;
  Am_Object cur_owner;
  Am_Object obj;
  int cur_top;
  int cur_left;
  Am_Object *owner_local;
  int *max_bottom_local;
  int *max_right_local;
  int *min_top_local;
  int *min_left_local;
  Am_Value_List *list_local;
  
  *min_left = 29999;
  *min_top = 29999;
  *max_right = -29999;
  *max_bottom = -29999;
  Am_Object::Am_Object(&cur_owner);
  Am_Object::Am_Object(&local_50);
  Am_Value_List::Start(list);
  do {
    bVar1 = Am_Value_List::Last(list);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Am_Object::~Am_Object(&local_50);
      Am_Object::~Am_Object(&cur_owner);
      return;
    }
    pAVar7 = Am_Value_List::Get(list);
    Am_Object::operator=(&cur_owner,pAVar7);
    Am_Object::Get_Owner(local_68,(Am_Slot_Flags)&cur_owner);
    Am_Object::operator=(&local_50,local_68);
    Am_Object::~Am_Object(local_68);
    bVar1 = Am_Object::Valid(&local_50);
    if (bVar1) {
      bVar1 = Am_Object::Valid(owner);
      if (bVar1) {
        bVar1 = Am_Object::operator!=(owner,&local_50);
        if (bVar1) {
          Am_Error("Moving objects from different groups.");
        }
      }
      else {
        Am_Object::operator=(owner,&local_50);
      }
    }
    Am_Object::Am_Object((Am_Object *)&x2,&Am_Line);
    bVar1 = Am_Object::Is_Instance_Of(&cur_owner,(Am_Object *)&x2);
    Am_Object::~Am_Object((Am_Object *)&x2);
    if (bVar1) {
      pAVar7 = Am_Object::Get(&cur_owner,0x8b,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&cur_owner,0x8d,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&cur_owner,0x8c,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&cur_owner,0x8e,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar7);
      iVar2 = IMIN(*min_left,iVar5);
      iVar2 = IMIN(iVar2,iVar3);
      *min_left = iVar2;
      iVar2 = IMIN(*min_top,iVar4);
      iVar2 = IMIN(iVar2,iVar6);
      *min_top = iVar2;
      iVar5 = IMAX(*max_right,iVar5);
      iVar5 = IMAX(iVar5,iVar3);
      *max_right = iVar5;
      iVar5 = IMAX(*max_bottom,iVar4);
      iVar5 = IMAX(iVar5,iVar6);
      *max_bottom = iVar5;
    }
    else {
      pAVar7 = Am_Object::Get(&cur_owner,100,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&cur_owner,0x65,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar7);
      iVar5 = IMIN(*min_left,iVar3);
      *min_left = iVar5;
      iVar5 = IMIN(*min_top,iVar4);
      *min_top = iVar5;
      iVar5 = *max_right;
      pAVar7 = Am_Object::Get(&cur_owner,0x66,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar7);
      iVar5 = IMAX(iVar5,iVar3 + iVar6);
      *max_right = iVar5;
      iVar5 = *max_bottom;
      pAVar7 = Am_Object::Get(&cur_owner,0x67,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      iVar5 = IMAX(iVar5,iVar4 + iVar3);
      *max_bottom = iVar5;
    }
    Am_Value_List::Next(list);
  } while( true );
}

Assistant:

void
calculate_group_size(Am_Value_List list, int &min_left, int &min_top,
                     int &max_right, int &max_bottom, Am_Object &owner)
{
  min_left = 29999;
  min_top = 29999;
  max_right = -29999;
  max_bottom = -29999;
  int cur_left, cur_top;
  Am_Object obj, cur_owner;
  for (list.Start(); !list.Last(); list.Next()) {
    obj = list.Get();
    cur_owner = obj.Get_Owner();
    if (cur_owner.Valid()) {
      if (!owner.Valid())
        owner = cur_owner;
      else if (owner != cur_owner)
        Am_Error("Moving objects from different groups.");
    }
    if (obj.Is_Instance_Of(Am_Line)) {
      int x1, x2, y1, y2;
      x1 = obj.Get(Am_X1);
      x2 = obj.Get(Am_X2);
      y1 = obj.Get(Am_Y1);
      y2 = obj.Get(Am_Y2);
      min_left = IMIN(IMIN(min_left, x1), x2);
      min_top = IMIN(IMIN(min_top, y1), y2);
      max_right = IMAX(IMAX(max_right, x1), x2);
      max_bottom = IMAX(IMAX(max_bottom, y1), y2);
    } else {
      cur_left = obj.Get(Am_LEFT);
      cur_top = obj.Get(Am_TOP);
      min_left = IMIN(min_left, cur_left);
      min_top = IMIN(min_top, cur_top);
      max_right = IMAX(max_right, cur_left + (int)obj.Get(Am_WIDTH));
      max_bottom = IMAX(max_bottom, cur_top + (int)obj.Get(Am_HEIGHT));
    }
  }
}